

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::~Thread(Thread *this)

{
  TraceSource *pTVar1;
  pointer pRVar2;
  pointer puVar3;
  pointer pVVar4;
  pointer pFVar5;
  set<wabt::interp::Thread_*,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  *this_00;
  pair<std::_Rb_tree_iterator<wabt::interp::Thread_*>,_std::_Rb_tree_iterator<wabt::interp::Thread_*>_>
  pVar6;
  Thread *local_18;
  
  this_00 = &this->store_->threads_;
  local_18 = this;
  pVar6 = std::
          _Rb_tree<wabt::interp::Thread_*,_wabt::interp::Thread_*,_std::_Identity<wabt::interp::Thread_*>,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
          ::equal_range(&this_00->_M_t,&local_18);
  std::
  _Rb_tree<wabt::interp::Thread_*,_wabt::interp::Thread_*,_std::_Identity<wabt::interp::Thread_*>,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  pTVar1 = (this->trace_source_)._M_t.
           super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
           .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl;
  if (pTVar1 != (TraceSource *)0x0) {
    (*(pTVar1->super_TraceSource)._vptr_TraceSource[1])();
  }
  (this->trace_source_)._M_t.
  super___uniq_ptr_impl<wabt::interp::Thread::TraceSource,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::interp::Thread::TraceSource_*,_std::default_delete<wabt::interp::Thread::TraceSource>_>
  .super__Head_base<0UL,_wabt::interp::Thread::TraceSource_*,_false>._M_head_impl =
       (TraceSource *)0x0;
  pRVar2 = (this->exceptions_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2,(long)(this->exceptions_).
                                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar2);
  }
  puVar3 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->refs_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  pVVar4 = (this->values_).
           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)(this->values_).
                                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar4);
  }
  pFVar5 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar5 != (pointer)0x0) {
    operator_delete(pFVar5,(long)(this->frames_).
                                 super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar5);
  }
  return;
}

Assistant:

Thread::~Thread() {
  store_.threads().erase(this);
}